

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-chest.c
# Opt level: O1

wchar_t pick_one_chest_trap(wchar_t level)

{
  uint32_t uVar1;
  chest_trap *pcVar2;
  bool bVar3;
  
  uVar1 = 0;
  for (pcVar2 = chest_traps->next; pcVar2 != (chest_trap *)0x0; pcVar2 = pcVar2->next) {
    uVar1 = uVar1 + (pcVar2->level <= level);
  }
  uVar1 = Rand_div(uVar1);
  pcVar2 = chest_traps;
  do {
    pcVar2 = pcVar2->next;
    bVar3 = uVar1 != 0;
    uVar1 = uVar1 - 1;
    if (pcVar2 == (chest_trap *)0x0) break;
  } while (bVar3);
  return pcVar2->pval;
}

Assistant:

static int pick_one_chest_trap(int level)
{
	int count = 0, pick;
	struct chest_trap *trap;

	/* Count possible traps (starting after the "locked" trap) */
	for (trap = chest_traps->next; trap; trap = trap->next) {
		if (trap->level <= level) count++;
	}

	/* Pick a trap, return the pval */
	pick = randint0(count);
	for (trap = chest_traps->next; trap; trap = trap->next) {
		if (!pick--) break;
	}
	return trap->pval;
}